

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

bool __thiscall
S2Builder::EdgeChainSimplifier::TargetInputVertices
          (EdgeChainSimplifier *this,VertexId v,S2PolylineSimplifier *simplifier)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar5;
  bool bVar6;
  
  pcVar2 = (this->site_vertices_->
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar5 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
             pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  else {
    paVar5 = &pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  }
  uVar1 = *(uint *)&pcVar2[v].super_compact_array_base<int,_std::allocator<int>_>;
  bVar6 = (uVar1 & 0xffffff) == 0;
  if ((!bVar6) &&
     (bVar3 = S2PolylineSimplifier::TargetDisc
                        (simplifier,
                         (this->builder_->input_vertices_).
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + *(int *)paVar5,
                         (S1ChordAngle)(this->builder_->edge_snap_radius_ca_).length2_), bVar3)) {
    uVar4 = 4;
    do {
      bVar6 = (uVar1 & 0xffffff) << 2 == uVar4;
      if (bVar6) {
        return bVar6;
      }
      bVar3 = S2PolylineSimplifier::TargetDisc
                        (simplifier,
                         (this->builder_->input_vertices_).
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + *(int *)((long)paVar5 + uVar4),
                         (S1ChordAngle)(this->builder_->edge_snap_radius_ca_).length2_);
      uVar4 = uVar4 + 4;
    } while (bVar3);
  }
  return bVar6;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::TargetInputVertices(
    VertexId v, S2PolylineSimplifier* simplifier) const {
  for (InputVertexId i : site_vertices_[v]) {
    if (!simplifier->TargetDisc(builder_.input_vertices_[i],
                                builder_.edge_snap_radius_ca_)) {
      return false;
    }
  }
  return true;
}